

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_test_interface.h
# Opt level: O0

void __thiscall
google::
BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
::erase(BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
        *this,iterator f,iterator l)

{
  iterator f_00;
  iterator l_00;
  long lVar1;
  long in_RDI;
  undefined1 *__src;
  undefined8 in_stack_ffffffffffffff68;
  undefined8 in_stack_ffffffffffffff70;
  nonempty_iterator in_stack_ffffffffffffff78;
  undefined8 uStack_80;
  nonempty_iterator local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined1 local_50 [24];
  sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  *psStack_38;
  undefined8 uStack_28;
  undefined8 local_20;
  undefined8 uStack_18;
  undefined8 local_10;
  
  __src = &stack0x00000050;
  lVar1 = in_RDI + 8;
  memcpy(local_50,&stack0x00000008,0x48);
  memcpy(&stack0xffffffffffffff68,__src,0x48);
  f_00.pos.row_begin._M_current =
       (sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)local_20;
  f_00.ht = (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
             *)uStack_28;
  f_00.pos.row_end._M_current =
       (sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)uStack_18;
  f_00.pos.row_current._M_current =
       (sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)local_10;
  f_00.pos.col_current = (nonempty_iterator)in_stack_ffffffffffffff68;
  f_00.end.row_begin._M_current =
       (sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)in_stack_ffffffffffffff70;
  f_00.end.row_end._M_current =
       (sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)in_stack_ffffffffffffff78;
  f_00.end.row_current._M_current =
       (sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)uStack_80;
  f_00.end.col_current = local_78;
  l_00.pos.row_begin._M_current =
       (sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)local_68;
  l_00.ht = (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
             *)uStack_70;
  l_00.pos.row_end._M_current =
       (sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)uStack_60;
  l_00.pos.row_current._M_current =
       (sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)local_58;
  l_00.pos.col_current = (nonempty_iterator)__src;
  l_00.end.row_begin._M_current =
       (sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)lVar1;
  l_00.end.row_end._M_current =
       (sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)in_stack_ffffffffffffff68;
  l_00.end.row_current._M_current =
       (sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)in_stack_ffffffffffffff70;
  l_00.end.col_current = in_stack_ffffffffffffff78;
  sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::erase(psStack_38,f_00,l_00);
  return;
}

Assistant:

void erase(typename HT::iterator f, typename HT::iterator l) {
    ht_.erase(f, l);
  }